

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsBySemitone
          (MidiMessage *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping,
          int program)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  byte local_ce;
  byte local_cd;
  uint local_cc;
  uchar msb;
  uchar lsb;
  double dStack_c8;
  int value;
  double fraction;
  double dStack_b8;
  int sint;
  double semitones;
  reference ppStack_a8;
  int keynum;
  pair<int,_double> *item_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range1_1;
  iterator iStack_80;
  uchar item;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vlv;
  value_type_conflict2 local_48 [16];
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int program_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping_local;
  MidiMessage *this_local;
  
  if (program < 0) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = program;
    if (0x7f < program) {
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0x7f;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    (mapping);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar2 * 4 + 10);
  local_48[3] = 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,local_48 + 3);
  local_48[2] = 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,local_48 + 2);
  local_48[1] = 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,local_48 + 1);
  local_48[0] = '\x02';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,local_48);
  vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ =
       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_1_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
             (value_type_conflict2 *)
             ((long)&vlv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    (mapping);
  intToVlv((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,(int)sVar2);
  __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  iStack_80 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff80), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1);
    __range1_1._7_1_ = *puVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               (value_type_conflict2 *)((long)&__range1_1 + 7));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                       (mapping);
  item_1 = (pair<int,_double> *)
           std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                     (mapping);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                             *)&item_1), bVar1) {
    ppStack_a8 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                 ::operator*(&__end1_1);
    semitones._4_4_ = ppStack_a8->first;
    if (semitones._4_4_ < 0) {
      semitones._4_4_ = 0;
    }
    else if (0x7f < semitones._4_4_) {
      semitones._4_4_ = 0x7f;
    }
    semitones._3_1_ = semitones._4_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               (value_type_conflict2 *)((long)&semitones + 3));
    dStack_b8 = ppStack_a8->second;
    fraction._4_4_ = (int)dStack_b8;
    if (fraction._4_4_ < 0) {
      fraction._4_4_ = 0;
    }
    else if (0x7f < fraction._4_4_) {
      fraction._4_4_ = 0x7f;
    }
    fraction._3_1_ = fraction._4_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               (value_type_conflict2 *)((long)&fraction + 3));
    dStack_c8 = dStack_b8 - (double)fraction._4_4_;
    local_cc = (uint)(dStack_c8 * 16384.0);
    local_cd = (byte)local_cc & 0x7f;
    local_ce = (byte)(local_cc >> 7) & 0x7f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_ce);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_cd);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(&__end1_1);
  }
  makeSysExMessage(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsBySemitone(std::vector<std::pair<int, double>>& mapping, int program) {
	if (program < 0) {
		program = 0;
	} else if (program > 127) {
		program = 127;
	}
	std::vector<uchar> data;
	data.reserve(mapping.size() * 4 + 10);
	data.push_back((uchar)0x7f);  // real-time sysex
	data.push_back((uchar)0x7f);  // all devices
	data.push_back((uchar)0x08);  // sub-ID#1 (MIDI Tuning)
	data.push_back((uchar)0x02);  // sub-ID#2 (note change)
	data.push_back((uchar)program);  // tuning program number (0 - 127)
	std::vector<uchar> vlv = intToVlv((int)mapping.size());
	for (uchar item : vlv) {
		data.push_back(item);
	}
	for (auto &item : mapping) {
		int keynum = item.first;
		if (keynum < 0) {
			keynum = 0;
		} else if (keynum > 127) {
			keynum = 127;
		}
		data.push_back((uchar)keynum);
		double semitones = item.second;
		int sint = (int)semitones;
		if (sint < 0) {
			sint = 0;
		} else if (sint > 127) {
			sint = 127;
		}
		data.push_back((uchar)sint);
		double fraction = semitones - sint;
		int value = int(fraction * (1 << 14));
		uchar lsb = value & 0x7f;
		uchar msb = (value >> 7) & 0x7f;
		data.push_back(msb);
		data.push_back(lsb);
    }
    this->makeSysExMessage(data);
}